

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O1

int BIO_puts(BIO *bp,char *buf)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = strlen(buf);
  if ((sVar2 & 0xffffffff80000000) != 0) {
    ERR_put_error(0x11,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0x9b);
    return -1;
  }
  iVar1 = BIO_write(bp,buf,(int)sVar2);
  return iVar1;
}

Assistant:

int BIO_puts(BIO *bio, const char *in) {
  size_t len = strlen(in);
  if (len > INT_MAX) {
    // |BIO_write| and the return value both assume the string fits in |int|.
    OPENSSL_PUT_ERROR(BIO, ERR_R_OVERFLOW);
    return -1;
  }
  return BIO_write(bio, in, (int)len);
}